

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedDescribedEntity.cpp
# Opt level: O2

string * __thiscall
NamedDescribedEntity::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,NamedDescribedEntity *this)

{
  ostream *poVar1;
  stringstream ss;
  string local_1e0 [32];
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"name:");
  std::__cxx11::string::string(local_1c0,(string *)&this->_m_name);
  poVar1 = std::operator<<(poVar1,local_1c0);
  poVar1 = std::operator<<(poVar1," - descr.");
  std::__cxx11::string::string(local_1e0,(string *)&this->_m_description);
  std::operator<<(poVar1,local_1e0);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string NamedDescribedEntity::SoftPrint() const 
{ 
    stringstream ss;
    ss << "name:" << this->GetName() 
       << " - descr." << this->GetDescription(); 
    return(ss.str());
}